

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeGetRequestedReserve(Btree *p)

{
  int *piVar1;
  BtShared *pBVar2;
  uint uVar3;
  u32 uVar4;
  byte bVar5;
  u32 uVar6;
  
  if (p->sharable == '\0') {
    pBVar2 = p->pBt;
    bVar5 = pBVar2->nReserveWanted;
    uVar4 = pBVar2->pageSize;
    uVar6 = pBVar2->usableSize;
  }
  else {
    p->wantToLock = p->wantToLock + 1;
    if (p->locked == '\0') {
      btreeLockCarefully(p);
      pBVar2 = p->pBt;
      bVar5 = pBVar2->nReserveWanted;
      uVar4 = pBVar2->pageSize;
      uVar6 = pBVar2->usableSize;
      if (p->sharable == '\0') goto LAB_00143440;
    }
    else {
      pBVar2 = p->pBt;
      bVar5 = pBVar2->nReserveWanted;
      uVar4 = pBVar2->pageSize;
      uVar6 = pBVar2->usableSize;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
LAB_00143440:
  uVar3 = uVar4 - uVar6;
  if ((int)(uVar4 - uVar6) <= (int)(uint)bVar5) {
    uVar3 = (uint)bVar5;
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetRequestedReserve(Btree *p){
  int n1, n2;
  sqlite3BtreeEnter(p);
  n1 = (int)p->pBt->nReserveWanted;
  n2 = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  return n1>n2 ? n1 : n2;
}